

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int ll_loadlib(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *sym;
  int stat;
  char *init;
  char *path;
  lua_State *L_local;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  sym = luaL_checklstring(L,2,(size_t *)0x0);
  iVar1 = lookforfunc(L,pcVar2,sym);
  if (iVar1 == 0) {
    L_local._4_4_ = 1;
  }
  else {
    lua_pushnil(L);
    lua_rotate(L,-2,1);
    pcVar2 = "init";
    if (iVar1 == 1) {
      pcVar2 = "absent";
    }
    lua_pushstring(L,pcVar2);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int ll_loadlib (lua_State *L) {
  const char *path = luaL_checkstring(L, 1);
  const char *init = luaL_checkstring(L, 2);
  int stat = lookforfunc(L, path, init);
  if (l_likely(stat == 0))  /* no errors? */
    return 1;  /* return the loaded function */
  else {  /* error; error message is on stack top */
    luaL_pushfail(L);
    lua_insert(L, -2);
    lua_pushstring(L, (stat == ERRLIB) ?  LIB_FAIL : "init");
    return 3;  /* return fail, error message, and where */
  }
}